

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

time_t zip_time(char *p)

{
  time_t tVar1;
  undefined1 local_50 [8];
  tm_conflict ts;
  wchar_t msDate;
  wchar_t msTime;
  char *p_local;
  
  ts.tm_zone._4_4_ = (uint)(byte)*p + (uint)(byte)p[1] * 0x100;
  ts.tm_zone._0_4_ = (uint)(byte)p[2] + (uint)(byte)p[3] * 0x100;
  memset(local_50,0,0x38);
  ts.tm_mday = ((int)(uint)ts.tm_zone >> 9 & 0x7fU) + L'P';
  ts.tm_hour = ((int)(uint)ts.tm_zone >> 5 & 0xfU) + L'\xffffffff';
  ts.tm_min = (uint)ts.tm_zone & 0x1f;
  ts.tm_sec = (int)ts.tm_zone._4_4_ >> 0xb & 0x1f;
  local_50._4_4_ = (int)ts.tm_zone._4_4_ >> 5 & 0x3f;
  local_50._0_4_ = (ts.tm_zone._4_4_ & 0x1f) << 1;
  ts.tm_wday = L'\xffffffff';
  tVar1 = mktime((tm *)local_50);
  return tVar1;
}

Assistant:

static time_t
zip_time(const char *p)
{
	int msTime, msDate;
	struct tm ts;

	msTime = (0xff & (unsigned)p[0]) + 256 * (0xff & (unsigned)p[1]);
	msDate = (0xff & (unsigned)p[2]) + 256 * (0xff & (unsigned)p[3]);

	memset(&ts, 0, sizeof(ts));
	ts.tm_year = ((msDate >> 9) & 0x7f) + 80; /* Years since 1900. */
	ts.tm_mon = ((msDate >> 5) & 0x0f) - 1; /* Month number. */
	ts.tm_mday = msDate & 0x1f; /* Day of month. */
	ts.tm_hour = (msTime >> 11) & 0x1f;
	ts.tm_min = (msTime >> 5) & 0x3f;
	ts.tm_sec = (msTime << 1) & 0x3e;
	ts.tm_isdst = -1;
	return mktime(&ts);
}